

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void ContinuousReadTest(BasePort *port,uchar boardNum)

{
  uint uVar1;
  ostream *poVar2;
  void *pvVar3;
  ulong local_40;
  unsigned_long count;
  size_t compareFailures;
  size_t readFailures;
  size_t success;
  char cStack_18;
  char cStack_17;
  char cStack_16;
  char buf [5];
  quadlet_t read_data;
  bool done;
  uchar boardNum_local;
  BasePort *port_local;
  
  buf[3] = '\0';
  readFailures = 0;
  compareFailures = 0;
  count = 0;
  local_40 = 0;
  buf[4] = boardNum;
  while (((buf[3] ^ 0xffU) & 1) != 0) {
    local_40 = local_40 + 1;
    cStack_18 = '\0';
    cStack_17 = '\0';
    cStack_16 = '\0';
    buf[0] = '\0';
    uVar1 = (*port->_vptr_BasePort[0x23])(port,(ulong)(byte)buf[4],4,&stack0xffffffffffffffe8);
    if ((uVar1 & 1) == 0) {
      compareFailures = compareFailures + 1;
    }
    else if (_cStack_18 == 0x514c4131) {
      readFailures = readFailures + 1;
    }
    else {
      count = count + 1;
    }
    if (5 < compareFailures + count) {
      buf[3] = '\x01';
    }
    if (9999 < local_40) {
      buf[3] = '\x01';
    }
    if (local_40 % 1000 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Success = ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,readFailures);
      poVar2 = std::operator<<(poVar2,", read failures = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,compareFailures);
      poVar2 = std::operator<<(poVar2,", compare failures = ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,count);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  if (local_40 % 1000 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Success = ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,readFailures);
    poVar2 = std::operator<<(poVar2,", read failures = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,compareFailures);
    poVar2 = std::operator<<(poVar2,", compare failures = ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,count);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void  ContinuousReadTest(BasePort *port, unsigned char boardNum)
{
    bool done = false;
    quadlet_t read_data;
    //char buf[5] = "QLA1";
    char buf[5] = "1ALQ";
    size_t success = 0;
    size_t readFailures = 0;
    size_t compareFailures = 0;
    unsigned long count = 0;
    while (!done) {
        count++;
        read_data = 0;
        if (!port->ReadQuadlet(boardNum, 4, read_data))
            readFailures++;
        else {
            if (memcmp((void *)&read_data, buf, 4) == 0)
                success++;
            else
                compareFailures++;
        }
        if (readFailures + compareFailures > 5) done = true;
        if (count >= 10000) done = true;

        // print status
        if (count % 1000 == 0) {
            std::cout << "Success = " << std::dec << success << ", read failures = " << readFailures << ", compare failures = "
                      << compareFailures << std::endl;
        }
    }
    if (count % 1000 != 0) {
        std::cout << "Success = " << std::dec << success << ", read failures = " << readFailures << ", compare failures = "
                  << compareFailures << std::endl;
    }
}